

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,beta_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if (((longdouble)0 < x._0_10_) && (x._0_10_ < (longdouble)1)) {
    in_RAX = (result_type_conflict3 *)
             math::detail::Beta_I<long_double>
                       ((longdouble *)__return_storage_ptr__,x._0_10_,
                        *(longdouble *)__return_storage_ptr__,
                        *(longdouble *)(__return_storage_ptr__ + 1),
                        *(longdouble *)(__return_storage_ptr__ + 2));
  }
  return in_RAX;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      if (x >= 1)
        return 1;
      return math::Beta_I(x, P.alpha(), P.beta(), P.norm());
    }